

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O2

void __thiscall
btQuantizedBvh::walkStacklessQuantizedTreeAgainstRay
          (btQuantizedBvh *this,btNodeOverlapCallback *nodeCallback,btVector3 *raySource,
          btVector3 *rayTarget,btVector3 *aabbMin,btVector3 *aabbMax,int startNodeIndex,
          int endNodeIndex)

{
  int iVar1;
  btVector3 bVar2;
  bool bVar3;
  int iVar4;
  btQuantizedBvhNode *aabbMin2;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  float fVar9;
  undefined1 auVar10 [16];
  btVector3 bVar11;
  btScalar param;
  btVector3 *local_d8;
  btVector3 *local_d0;
  unsigned_short quantizedQueryAabbMax [3];
  unsigned_short quantizedQueryAabbMin [3];
  btVector3 local_b8;
  undefined8 local_a8;
  float local_a0;
  btScalar bStack_9c;
  btNodeOverlapCallback *local_98;
  btVector3 *local_90;
  ulong local_88;
  uint local_80;
  float local_78;
  btScalar bStack_74;
  btVector3 rayDirection;
  btVector3 local_58;
  btVector3 local_48;
  
  uVar6 = (ulong)startNodeIndex;
  aabbMin2 = (this->m_quantizedContiguousNodes).m_data + uVar6;
  local_d8 = aabbMin;
  local_d0 = aabbMax;
  local_98 = nodeCallback;
  rayDirection = operator-(rayTarget,raySource);
  btVector3::normalize(&rayDirection);
  bVar11 = operator-(rayTarget,raySource);
  bVar2 = rayDirection;
  bStack_74 = bVar11.m_floats[3];
  auVar10._8_8_ = 0;
  auVar10._0_4_ = rayDirection.m_floats[0];
  auVar10._4_4_ = rayDirection.m_floats[1];
  local_78 = bVar11.m_floats[2] * rayDirection.m_floats[2] +
             bVar11.m_floats[0] * bVar2.m_floats[0] + bVar2.m_floats[1] * bVar11.m_floats[1];
  auVar10 = divps(_DAT_001af400,auVar10);
  uVar7 = -(uint)(bVar2.m_floats[0] == 0.0);
  uVar8 = -(uint)(bVar2.m_floats[1] == 0.0);
  rayDirection.m_floats[0] = (btScalar)(uVar7 & 0x5d5e0b6b | ~uVar7 & auVar10._0_4_);
  rayDirection.m_floats[1] = (btScalar)(uVar8 & 0x5d5e0b6b | ~uVar8 & auVar10._4_4_);
  rayDirection.m_floats[2] =
       (btScalar)
       (-(uint)(rayDirection.m_floats[2] == 0.0) & 0x5d5e0b6b |
       ~-(uint)(rayDirection.m_floats[2] == 0.0) & (uint)(1.0 / rayDirection.m_floats[2]));
  rayDirection.m_floats[3] = bVar2.m_floats[3];
  local_88 = CONCAT44(-(uint)(rayDirection.m_floats[1] < 0.0),
                      -(uint)(rayDirection.m_floats[0] < 0.0)) & 0x100000001;
  local_80 = (uint)(rayDirection.m_floats[2] < 0.0);
  local_48.m_floats._0_8_ = *(undefined8 *)raySource->m_floats;
  local_48.m_floats._8_8_ = *(undefined8 *)(raySource->m_floats + 2);
  local_58.m_floats._0_8_ = *(undefined8 *)raySource->m_floats;
  local_58.m_floats._8_8_ = *(undefined8 *)(raySource->m_floats + 2);
  local_90 = raySource;
  btVector3::setMin(&local_48,rayTarget);
  btVector3::setMax(&local_58,rayTarget);
  fVar9 = local_48.m_floats[0];
  local_48.m_floats[1] =
       local_48.m_floats[1] + (float)((ulong)*(undefined8 *)local_d8->m_floats >> 0x20);
  local_48.m_floats[0] = fVar9 + (float)*(undefined8 *)local_d8->m_floats;
  local_48.m_floats[2] = local_d8->m_floats[2] + local_48.m_floats[2];
  fVar9 = local_58.m_floats[0];
  local_58.m_floats[1] =
       local_58.m_floats[1] + (float)((ulong)*(undefined8 *)local_d0->m_floats >> 0x20);
  local_58.m_floats[0] = fVar9 + (float)*(undefined8 *)local_d0->m_floats;
  local_58.m_floats[2] = local_d0->m_floats[2] + local_58.m_floats[2];
  iVar4 = 0;
  quantizeWithClamp(this,quantizedQueryAabbMin,&local_48,0);
  quantizeWithClamp(this,quantizedQueryAabbMax,&local_58,1);
  do {
    iVar5 = (int)uVar6;
    if (endNodeIndex <= iVar5) {
      if (maxIterations < iVar4) {
        maxIterations = iVar4;
      }
      return;
    }
    param = 1.0;
    uVar7 = testQuantizedAabbAgainstQuantizedAabb
                      (quantizedQueryAabbMin,quantizedQueryAabbMax,aabbMin2->m_quantizedAabbMin,
                       aabbMin2->m_quantizedAabbMax);
    iVar1 = aabbMin2->m_escapeIndexOrTriangleIndex;
    if (uVar7 == 0) {
      bVar3 = false;
LAB_00133e1f:
      if ((-1 < iVar1) || (bVar3 != false)) goto LAB_00133e38;
      uVar7 = iVar5 - aabbMin2->m_escapeIndexOrTriangleIndex;
      aabbMin2 = aabbMin2 + -(long)aabbMin2->m_escapeIndexOrTriangleIndex;
    }
    else {
      local_b8 = unQuantize(this,aabbMin2->m_quantizedAabbMin);
      bVar11 = unQuantize(this,aabbMin2->m_quantizedAabbMax);
      bVar2.m_floats = local_b8.m_floats;
      fVar9 = local_b8.m_floats[0];
      local_b8.m_floats[1] =
           local_b8.m_floats[1] - (float)((ulong)*(undefined8 *)local_d0->m_floats >> 0x20);
      local_b8.m_floats[0] = fVar9 - (float)*(undefined8 *)local_d0->m_floats;
      local_b8.m_floats[2] = bVar2.m_floats[2];
      local_b8.m_floats[3] = bVar2.m_floats[3];
      local_b8.m_floats[2] = local_b8.m_floats[2] - local_d0->m_floats[2];
      local_a8 = CONCAT44(bVar11.m_floats[1] -
                          (float)((ulong)*(undefined8 *)local_d8->m_floats >> 0x20),
                          bVar11.m_floats[0] - (float)*(undefined8 *)local_d8->m_floats);
      _local_a0 = CONCAT44(bVar11.m_floats[3],bVar11.m_floats[2] - local_d8->m_floats[2]);
      bVar3 = btRayAabb2(local_90,&rayDirection,(uint *)&local_88,&local_b8,&param,0.0,local_78);
      if ((iVar1 < 0) || (!bVar3)) goto LAB_00133e1f;
      (*local_98->_vptr_btNodeOverlapCallback[2])
                (local_98,(ulong)(uint)(aabbMin2->m_escapeIndexOrTriangleIndex >> 0x15),
                 (ulong)(aabbMin2->m_escapeIndexOrTriangleIndex & 0x1fffff));
LAB_00133e38:
      aabbMin2 = aabbMin2 + 1;
      uVar7 = iVar5 + 1;
    }
    uVar6 = (ulong)uVar7;
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

void	btQuantizedBvh::walkStacklessQuantizedTreeAgainstRay(btNodeOverlapCallback* nodeCallback, const btVector3& raySource, const btVector3& rayTarget, const btVector3& aabbMin, const btVector3& aabbMax, int startNodeIndex,int endNodeIndex) const
{
	btAssert(m_useQuantization);
	
	int curIndex = startNodeIndex;
	int walkIterations = 0;
	int subTreeSize = endNodeIndex - startNodeIndex;
	(void)subTreeSize;

	const btQuantizedBvhNode* rootNode = &m_quantizedContiguousNodes[startNodeIndex];
	int escapeIndex;
	
	bool isLeafNode;
	//PCK: unsigned instead of bool
	unsigned boxBoxOverlap = 0;
	unsigned rayBoxOverlap = 0;

	btScalar lambda_max = 1.0;

#ifdef RAYAABB2
	btVector3 rayDirection = (rayTarget-raySource);
	rayDirection.normalize ();
	lambda_max = rayDirection.dot(rayTarget-raySource);
	///what about division by zero? --> just set rayDirection[i] to 1.0
	rayDirection[0] = rayDirection[0] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDirection[0];
	rayDirection[1] = rayDirection[1] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDirection[1];
	rayDirection[2] = rayDirection[2] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDirection[2];
	unsigned int sign[3] = { rayDirection[0] < 0.0, rayDirection[1] < 0.0, rayDirection[2] < 0.0};
#endif

	/* Quick pruning by quantized box */
	btVector3 rayAabbMin = raySource;
	btVector3 rayAabbMax = raySource;
	rayAabbMin.setMin(rayTarget);
	rayAabbMax.setMax(rayTarget);

	/* Add box cast extents to bounding box */
	rayAabbMin += aabbMin;
	rayAabbMax += aabbMax;

	unsigned short int quantizedQueryAabbMin[3];
	unsigned short int quantizedQueryAabbMax[3];
	quantizeWithClamp(quantizedQueryAabbMin,rayAabbMin,0);
	quantizeWithClamp(quantizedQueryAabbMax,rayAabbMax,1);

	while (curIndex < endNodeIndex)
	{

//#define VISUALLY_ANALYZE_BVH 1
#ifdef VISUALLY_ANALYZE_BVH
		//some code snippet to debugDraw aabb, to visually analyze bvh structure
		static int drawPatch = 0;
		//need some global access to a debugDrawer
		extern btIDebugDraw* debugDrawerPtr;
		if (curIndex==drawPatch)
		{
			btVector3 aabbMin,aabbMax;
			aabbMin = unQuantize(rootNode->m_quantizedAabbMin);
			aabbMax = unQuantize(rootNode->m_quantizedAabbMax);
			btVector3	color(1,0,0);
			debugDrawerPtr->drawAabb(aabbMin,aabbMax,color);
		}
#endif//VISUALLY_ANALYZE_BVH

		//catch bugs in tree data
		btAssert (walkIterations < subTreeSize);

		walkIterations++;
		//PCK: unsigned instead of bool
		// only interested if this is closer than any previous hit
		btScalar param = 1.0;
		rayBoxOverlap = 0;
		boxBoxOverlap = testQuantizedAabbAgainstQuantizedAabb(quantizedQueryAabbMin,quantizedQueryAabbMax,rootNode->m_quantizedAabbMin,rootNode->m_quantizedAabbMax);
		isLeafNode = rootNode->isLeafNode();
		if (boxBoxOverlap)
		{
			btVector3 bounds[2];
			bounds[0] = unQuantize(rootNode->m_quantizedAabbMin);
			bounds[1] = unQuantize(rootNode->m_quantizedAabbMax);
			/* Add box cast extents */
			bounds[0] -= aabbMax;
			bounds[1] -= aabbMin;
			btVector3 normal;
#if 0
			bool ra2 = btRayAabb2 (raySource, rayDirection, sign, bounds, param, 0.0, lambda_max);
			bool ra = btRayAabb (raySource, rayTarget, bounds[0], bounds[1], param, normal);
			if (ra2 != ra)
			{
				printf("functions don't match\n");
			}
#endif
#ifdef RAYAABB2
			///careful with this check: need to check division by zero (above) and fix the unQuantize method
			///thanks Joerg/hiker for the reproduction case!
			///http://www.bulletphysics.com/Bullet/phpBB3/viewtopic.php?f=9&t=1858

			//BT_PROFILE("btRayAabb2");
			rayBoxOverlap = btRayAabb2 (raySource, rayDirection, sign, bounds, param, 0.0f, lambda_max);
			
#else
			rayBoxOverlap = true;//btRayAabb(raySource, rayTarget, bounds[0], bounds[1], param, normal);
#endif
		}
		
		if (isLeafNode && rayBoxOverlap)
		{
			nodeCallback->processNode(rootNode->getPartId(),rootNode->getTriangleIndex());
		}
		
		//PCK: unsigned instead of bool
		if ((rayBoxOverlap != 0) || isLeafNode)
		{
			rootNode++;
			curIndex++;
		} else
		{
			escapeIndex = rootNode->getEscapeIndex();
			rootNode += escapeIndex;
			curIndex += escapeIndex;
		}
	}
	if (maxIterations < walkIterations)
		maxIterations = walkIterations;

}